

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPMCQueue.h
# Opt level: O0

bool __thiscall
rigtorp::mpmc::Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_>::try_pop
          (Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_> *this,int *v)

{
  atomic<unsigned_long> *paVar1;
  size_t sVar2;
  Slot<int> *pSVar3;
  undefined1 *puVar4;
  Slot<int> *pSVar5;
  int *piVar6;
  __int_type_conflict prevTail;
  Slot<int> *slot;
  __int_type_conflict tail;
  int *v_local;
  Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_> *this_local;
  Slot<int> *local_c0;
  memory_order local_b8;
  int local_b4;
  memory_order __b_3;
  __int_type_conflict local_a8;
  memory_order local_a0;
  int local_9c;
  memory_order __b_1;
  Slot<int> *local_90;
  memory_order local_88;
  int local_84;
  memory_order __b;
  int local_6c;
  memory_order __b_2;
  Slot<int> *local_60;
  undefined4 local_54;
  undefined1 *local_50;
  Slot<int> **local_48;
  atomic<unsigned_long> *local_40;
  bool local_31;
  undefined1 *local_30;
  memory_order local_28;
  undefined4 local_24;
  undefined1 *local_20;
  Slot<int> **local_18;
  atomic<unsigned_long> *local_10;
  
  paVar1 = &this->tail_;
  local_84 = 2;
  tail = (__int_type_conflict)v;
  v_local = (int *)this;
  ___b = paVar1;
  local_88 = std::operator&(memory_order_acquire,__memory_order_mask);
  if (local_84 - 1U < 2) {
    local_90 = (Slot<int> *)(paVar1->super___atomic_base<unsigned_long>)._M_i;
  }
  else if (local_84 == 5) {
    local_90 = (Slot<int> *)(paVar1->super___atomic_base<unsigned_long>)._M_i;
  }
  else {
    local_90 = (Slot<int> *)(paVar1->super___atomic_base<unsigned_long>)._M_i;
  }
  slot = local_90;
  do {
    while( true ) {
      pSVar3 = this->slots_;
      sVar2 = idx(this,(size_t)slot);
      pSVar3 = pSVar3 + sVar2;
      sVar2 = turn(this,(size_t)slot);
      local_9c = 2;
      ___b_1 = pSVar3;
      local_a0 = std::operator&(memory_order_acquire,__memory_order_mask);
      pSVar5 = slot;
      if (local_9c - 1U < 2) {
        local_a8 = (pSVar3->turn).super___atomic_base<unsigned_long>._M_i;
      }
      else if (local_9c == 5) {
        local_a8 = (pSVar3->turn).super___atomic_base<unsigned_long>._M_i;
      }
      else {
        local_a8 = (pSVar3->turn).super___atomic_base<unsigned_long>._M_i;
      }
      if (sVar2 * 2 + 1 == local_a8) break;
      paVar1 = &this->tail_;
      local_b4 = 2;
      ___b_3 = paVar1;
      local_b8 = std::operator&(memory_order_acquire,__memory_order_mask);
      if (local_b4 - 1U < 2) {
        local_c0 = (Slot<int> *)(paVar1->super___atomic_base<unsigned_long>)._M_i;
      }
      else if (local_b4 == 5) {
        local_c0 = (Slot<int> *)(paVar1->super___atomic_base<unsigned_long>)._M_i;
      }
      else {
        local_c0 = (Slot<int> *)(paVar1->super___atomic_base<unsigned_long>)._M_i;
      }
      slot = local_c0;
      if (local_c0 == pSVar5) {
        return false;
      }
    }
    paVar1 = &this->tail_;
    puVar4 = (undefined1 *)((long)&(slot->turn).super___atomic_base<unsigned_long>._M_i + 1);
    local_54 = 5;
    local_50 = puVar4;
    local_48 = &slot;
    local_40 = paVar1;
    local_28 = std::__cmpexch_failure_order(memory_order_seq_cst);
    local_24 = 5;
    switch(0x1068bb) {
    default:
      if (local_28 - memory_order_consume < 2) {
        LOCK();
        pSVar5 = (Slot<int> *)(paVar1->super___atomic_base<unsigned_long>)._M_i;
        local_31 = slot == pSVar5;
        if (local_31) {
          (paVar1->super___atomic_base<unsigned_long>)._M_i = (__int_type_conflict)puVar4;
          pSVar5 = slot;
        }
        UNLOCK();
        if (!local_31) {
          slot = pSVar5;
        }
      }
      else if (local_28 == memory_order_seq_cst) {
        LOCK();
        pSVar5 = (Slot<int> *)(paVar1->super___atomic_base<unsigned_long>)._M_i;
        local_31 = slot == pSVar5;
        if (local_31) {
          (paVar1->super___atomic_base<unsigned_long>)._M_i = (__int_type_conflict)puVar4;
          pSVar5 = slot;
        }
        UNLOCK();
        if (!local_31) {
          slot = pSVar5;
        }
      }
      else {
        LOCK();
        pSVar5 = (Slot<int> *)(paVar1->super___atomic_base<unsigned_long>)._M_i;
        local_31 = slot == pSVar5;
        if (local_31) {
          (paVar1->super___atomic_base<unsigned_long>)._M_i = (__int_type_conflict)puVar4;
          pSVar5 = slot;
        }
        UNLOCK();
        if (!local_31) {
          slot = pSVar5;
        }
      }
      break;
    case 2:
      if (local_28 - memory_order_consume < 2) {
        LOCK();
        pSVar5 = (Slot<int> *)(paVar1->super___atomic_base<unsigned_long>)._M_i;
        local_31 = slot == pSVar5;
        if (local_31) {
          (paVar1->super___atomic_base<unsigned_long>)._M_i = (__int_type_conflict)puVar4;
          pSVar5 = slot;
        }
        UNLOCK();
        if (!local_31) {
          slot = pSVar5;
        }
      }
      else if (local_28 == memory_order_seq_cst) {
        LOCK();
        pSVar5 = (Slot<int> *)(paVar1->super___atomic_base<unsigned_long>)._M_i;
        local_31 = slot == pSVar5;
        if (local_31) {
          (paVar1->super___atomic_base<unsigned_long>)._M_i = (__int_type_conflict)puVar4;
          pSVar5 = slot;
        }
        UNLOCK();
        if (!local_31) {
          slot = pSVar5;
        }
      }
      else {
        LOCK();
        pSVar5 = (Slot<int> *)(paVar1->super___atomic_base<unsigned_long>)._M_i;
        local_31 = slot == pSVar5;
        if (local_31) {
          (paVar1->super___atomic_base<unsigned_long>)._M_i = (__int_type_conflict)puVar4;
          pSVar5 = slot;
        }
        UNLOCK();
        if (!local_31) {
          slot = pSVar5;
        }
      }
      break;
    case 3:
      if (local_28 - memory_order_consume < 2) {
        LOCK();
        pSVar5 = (Slot<int> *)(paVar1->super___atomic_base<unsigned_long>)._M_i;
        local_31 = slot == pSVar5;
        if (local_31) {
          (paVar1->super___atomic_base<unsigned_long>)._M_i = (__int_type_conflict)puVar4;
          pSVar5 = slot;
        }
        UNLOCK();
        if (!local_31) {
          slot = pSVar5;
        }
      }
      else if (local_28 == memory_order_seq_cst) {
        LOCK();
        pSVar5 = (Slot<int> *)(paVar1->super___atomic_base<unsigned_long>)._M_i;
        local_31 = slot == pSVar5;
        if (local_31) {
          (paVar1->super___atomic_base<unsigned_long>)._M_i = (__int_type_conflict)puVar4;
          pSVar5 = slot;
        }
        UNLOCK();
        if (!local_31) {
          slot = pSVar5;
        }
      }
      else {
        LOCK();
        pSVar5 = (Slot<int> *)(paVar1->super___atomic_base<unsigned_long>)._M_i;
        local_31 = slot == pSVar5;
        if (local_31) {
          (paVar1->super___atomic_base<unsigned_long>)._M_i = (__int_type_conflict)puVar4;
          pSVar5 = slot;
        }
        UNLOCK();
        if (!local_31) {
          slot = pSVar5;
        }
      }
      break;
    case 4:
      if (local_28 - memory_order_consume < 2) {
        LOCK();
        pSVar5 = (Slot<int> *)(paVar1->super___atomic_base<unsigned_long>)._M_i;
        local_31 = slot == pSVar5;
        if (local_31) {
          (paVar1->super___atomic_base<unsigned_long>)._M_i = (__int_type_conflict)puVar4;
          pSVar5 = slot;
        }
        UNLOCK();
        if (!local_31) {
          slot = pSVar5;
        }
      }
      else if (local_28 == memory_order_seq_cst) {
        LOCK();
        pSVar5 = (Slot<int> *)(paVar1->super___atomic_base<unsigned_long>)._M_i;
        local_31 = slot == pSVar5;
        if (local_31) {
          (paVar1->super___atomic_base<unsigned_long>)._M_i = (__int_type_conflict)puVar4;
          pSVar5 = slot;
        }
        UNLOCK();
        if (!local_31) {
          slot = pSVar5;
        }
      }
      else {
        LOCK();
        pSVar5 = (Slot<int> *)(paVar1->super___atomic_base<unsigned_long>)._M_i;
        local_31 = slot == pSVar5;
        if (local_31) {
          (paVar1->super___atomic_base<unsigned_long>)._M_i = (__int_type_conflict)puVar4;
          pSVar5 = slot;
        }
        UNLOCK();
        if (!local_31) {
          slot = pSVar5;
        }
      }
    }
    local_30 = puVar4;
    local_20 = puVar4;
    local_18 = &slot;
    local_10 = paVar1;
  } while (local_31 == false);
  piVar6 = Slot<int>::move(pSVar3);
  *(int *)tail = *piVar6;
  Slot<int>::destroy(pSVar3);
  sVar2 = turn(this,(size_t)slot);
  ___b_2 = sVar2 * 2 + 2;
  local_6c = 3;
  local_60 = pSVar3;
  std::operator&(memory_order_release,__memory_order_mask);
  if (local_6c == 3) {
    (pSVar3->turn).super___atomic_base<unsigned_long>._M_i = ___b_2;
  }
  else if (local_6c == 5) {
    LOCK();
    (pSVar3->turn).super___atomic_base<unsigned_long>._M_i = ___b_2;
    UNLOCK();
  }
  else {
    (pSVar3->turn).super___atomic_base<unsigned_long>._M_i = ___b_2;
  }
  return true;
}

Assistant:

bool try_pop(T &v) noexcept {
    auto tail = tail_.load(std::memory_order_acquire);
    for (;;) {
      auto &slot = slots_[idx(tail)];
      if (turn(tail) * 2 + 1 == slot.turn.load(std::memory_order_acquire)) {
        if (tail_.compare_exchange_strong(tail, tail + 1)) {
          v = slot.move();
          slot.destroy();
          slot.turn.store(turn(tail) * 2 + 2, std::memory_order_release);
          return true;
        }
      } else {
        auto const prevTail = tail;
        tail = tail_.load(std::memory_order_acquire);
        if (tail == prevTail) {
          return false;
        }
      }
    }
  }